

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

int qstrnicmp(char *str1,qsizetype len1,char *str2,qsizetype len2)

{
  long lVar1;
  longlong *plVar2;
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  int res_1;
  qsizetype i_1;
  qsizetype len;
  int res;
  uchar c;
  qsizetype i;
  uchar *s2;
  uchar *s1;
  long local_60;
  long local_48;
  uint local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI == 0) || (in_RSI == 0)) {
    if (in_RCX == 0) {
      local_1c = 0;
    }
    else if (in_RCX == -1) {
      bVar3 = true;
      if (in_RDX != (char *)0x0) {
        bVar3 = *in_RDX == '\0';
      }
      local_1c = 0xffffffff;
      if (bVar3) {
        local_1c = 0;
      }
    }
    else {
      local_1c = 0xffffffff;
    }
  }
  else if (in_RDX == (char *)0x0) {
    local_1c = (uint)(in_RSI != 0);
  }
  else {
    local_10 = in_RSI;
    if (in_RCX == -1) {
      for (local_48 = 0; local_48 < local_10; local_48 = local_48 + 1) {
        if (in_RDX[local_48] == '\0') {
          local_1c = 1;
          goto LAB_004b21cb;
        }
        local_1c = QtMiscUtils::caseCompareAscii('\0','\0');
        if (local_1c != 0) goto LAB_004b21cb;
      }
      local_1c = 0;
      if (in_RDX[local_48] != '\0') {
        local_1c = 0xffffffff;
      }
    }
    else {
      local_18 = in_RCX;
      plVar2 = qMin<long_long>(&local_10,&local_18);
      lVar1 = *plVar2;
      for (local_60 = 0; local_60 < lVar1; local_60 = local_60 + 1) {
        local_1c = QtMiscUtils::caseCompareAscii('\0','\0');
        if (local_1c != 0) goto LAB_004b21cb;
      }
      if (local_10 == local_18) {
        local_1c = 0;
      }
      else {
        local_1c = 1;
        if (local_10 < local_18) {
          local_1c = 0xffffffff;
        }
      }
    }
  }
LAB_004b21cb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

int qstrnicmp(const char *str1, qsizetype len1, const char *str2, qsizetype len2)
{
    Q_ASSERT(len1 >= 0);
    Q_ASSERT(len2 >= -1);
    const uchar *s1 = reinterpret_cast<const uchar *>(str1);
    const uchar *s2 = reinterpret_cast<const uchar *>(str2);
    if (!s1 || !len1) {
        if (len2 == 0)
            return 0;
        if (len2 == -1)
            return (!s2 || !*s2) ? 0 : -1;
        Q_ASSERT(s2);
        return -1;
    }
    if (!s2)
        return len1 == 0 ? 0 : 1;

    if (len2 == -1) {
        // null-terminated str2
        qsizetype i;
        for (i = 0; i < len1; ++i) {
            const uchar c = s2[i];
            if (!c)
                return 1;

            if (int res = QtMiscUtils::caseCompareAscii(s1[i], c))
                return res;
        }
        return s2[i] ? -1 : 0;
    } else {
        // not null-terminated
        const qsizetype len = qMin(len1, len2);
        for (qsizetype i = 0; i < len; ++i) {
            if (int res = QtMiscUtils::caseCompareAscii(s1[i], s2[i]))
                return res;
        }
        if (len1 == len2)
            return 0;
        return len1 < len2 ? -1 : 1;
    }
}